

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::advance_past_empty_and_deleted
          (dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
           *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *pdVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  
  piVar6 = this->pos;
  piVar3 = this->end;
  if (piVar6 != piVar3) {
    pdVar4 = this->ht;
    iVar7 = (pdVar4->key_info).super_Hasher.num_compares_;
    do {
      iVar2 = (pdVar4->key_info).empty_key;
      iVar1 = *piVar6;
      (pdVar4->key_info).super_Hasher.num_compares_ = iVar7 + 1;
      iVar5 = iVar7 + 1;
      if (iVar2 != iVar1) {
        if (pdVar4->num_deleted == '\0') {
          return;
        }
        iVar2 = (pdVar4->key_info).delkey;
        iVar1 = *piVar6;
        (pdVar4->key_info).super_Hasher.num_compares_ = iVar7 + 2;
        iVar5 = iVar7 + 2;
        if (iVar2 != iVar1) {
          return;
        }
      }
      iVar7 = iVar5;
      piVar6 = piVar6 + 1;
      this->pos = piVar6;
    } while (piVar6 != piVar3);
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }